

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

FxExpression * __thiscall FxClassPtrCast::Resolve(FxClassPtrCast *this,FCompileContext *ctx)

{
  PClassPointer *dtype;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar4;
  FxClassTypeCast *this_00;
  undefined4 extraout_var_00;
  char *pcVar5;
  char *pcVar6;
  FCompileContext *size;
  PType *this_01;
  FxExpression *pFVar3;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->basex == (FxExpression *)0x0) {
LAB_0051a4b0:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return (FxExpression *)0x0;
  }
  size = ctx;
  iVar2 = (*this->basex->_vptr_FxExpression[2])();
  pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
  this->basex = pFVar3;
  if (pFVar3 == (FxExpression *)0x0) goto LAB_0051a4b0;
  dtype = (PClassPointer *)(this->super_FxExpression).ValueType;
  if ((PPointer *)pFVar3->ValueType == TypeNullPtr) {
LAB_0051a4dd:
    pFVar3->ValueType = (PType *)dtype;
    this->basex = (FxExpression *)0x0;
  }
  else {
    pPVar4 = DObject::GetClass((DObject *)pFVar3->ValueType);
    this_01 = this->basex->ValueType;
    if (pPVar4 == PClassPointer::RegistrationInfo.MyClass) {
      bVar1 = PClass::IsAncestorOf
                        (dtype->ClassRestriction,
                         (PClass *)
                         (((PBasicType *)&this_01[1].super_PTypeBase)->super_PType).super_PTypeBase.
                         super_DObject.ObjNext);
      if (bVar1) {
        pFVar3 = this->basex;
        goto LAB_0051a4dd;
      }
      bVar1 = PClass::IsAncestorOf
                        ((PClass *)
                         (((PBasicType *)&this_01[1].super_PTypeBase)->super_PType).super_PTypeBase.
                         super_DObject.ObjNext,dtype->ClassRestriction);
      if (bVar1) {
        return &this->super_FxExpression;
      }
      this_01 = this->basex->ValueType;
    }
    else if ((this_01 == (PType *)TypeString) || (this_01 == (PType *)TypeName)) {
      this_00 = (FxClassTypeCast *)FxExpression::operator_new((FxExpression *)0x38,(size_t)size);
      FxClassTypeCast::FxClassTypeCast(this_00,dtype,this->basex);
      this->basex = (FxExpression *)0x0;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      iVar2 = (*(this_00->super_FxExpression)._vptr_FxExpression[2])(this_00,ctx);
      return (FxExpression *)CONCAT44(extraout_var_00,iVar2);
    }
    pcVar5 = PType::DescriptiveName(this_01);
    pcVar6 = PType::DescriptiveName((PType *)dtype);
    pFVar3 = (FxExpression *)0x0;
    FScriptPosition::Message
              (&(this->super_FxExpression).ScriptPosition,2,
               "Cannot cast %s to %s. The types are incompatible.",pcVar5,pcVar6);
  }
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return pFVar3;
}

Assistant:

FxExpression *FxClassPtrCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeNullPtr)
	{
		basex->ValueType = ValueType;
		auto x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	auto to = static_cast<PClassPointer *>(ValueType);
	if (basex->ValueType->GetClass() == RUNTIME_CLASS(PClassPointer))
	{
		auto from = static_cast<PClassPointer *>(basex->ValueType);
		// Downcast is always ok.
		if (from->ClassRestriction->IsDescendantOf(to->ClassRestriction))
		{
			basex->ValueType = to;
			auto x = basex;
			basex = nullptr;
			delete this;
			return x;
		}
		// Upcast needs a runtime check.
		else if (to->ClassRestriction->IsDescendantOf(from->ClassRestriction))
		{
			return this;
		}
	}
	else if (basex->ValueType == TypeString || basex->ValueType == TypeName)
	{
		FxExpression *x = new FxClassTypeCast(to, basex);
		basex = nullptr;
		delete this;
		return x->Resolve(ctx);
	}
	// Everything else is an error.
	ScriptPosition.Message(MSG_ERROR, "Cannot cast %s to %s. The types are incompatible.", basex->ValueType->DescriptiveName(), to->DescriptiveName());
	delete this;
	return nullptr;
}